

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O3

void __thiscall perf::suite::run(suite *this)

{
  _Any_data *p_Var1;
  bool bVar2;
  long lVar3;
  long lVar4;
  _Any_data *this_00;
  _Any_data *p_Var5;
  
  (this->m_total_time).__r = 0;
  p_Var5 = (_Any_data *)
           (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Any_data *)
           (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = (_Any_data *)this;
  while( true ) {
    if (p_Var5 == p_Var1) {
      return;
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    if (*(long *)(p_Var5 + 1) == 0) break;
    this_00 = p_Var5;
    bVar2 = (**(code **)((long)p_Var5 + 0x18))(p_Var5);
    p_Var5[4]._M_pod_data[0] = bVar2;
    lVar4 = std::chrono::_V2::system_clock::now();
    *(long *)((long)p_Var5 + 0x48) = lVar4 - lVar3;
    (this->m_total_time).__r = (this->m_total_time).__r + (lVar4 - lVar3);
    p_Var5 = p_Var5 + 5;
  }
  std::__throw_bad_function_call();
  if (*(_Any_data **)(this_00 + 2) != this_00 + 3) {
    operator_delete(*(_Any_data **)(this_00 + 2),*(long *)(this_00 + 3) + 1);
  }
  std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>::~vector
            ((vector<perf::perf_case,_std::allocator<perf::perf_case>_> *)this_00);
  return;
}

Assistant:

void run()
        {
            clock clk;
            time_point time_start, time_stop;
            m_total_time = nanoseconds(0);

            for (auto &c : m_cases)
            {
                time_start = clk.now();
                try
                {
                    c.success = c.f();
                }
                catch (...)
                {
                    c.success = false;
                }
                time_stop = clk.now();
                c.time = time_stop - time_start;
                m_total_time += c.time;
            }
        }